

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void glfwTerminate(void)

{
  _GLFWmonitor *monitor;
  long lVar1;
  
  if (_glfwInitialized != 0) {
    _glfw.callbacks.monitor = (GLFWmonitorfun)0x0;
    _glfw.callbacks.joystick = (GLFWjoystickfun)0x0;
    while (_glfw.windowListHead != (_GLFWwindow *)0x0) {
      glfwDestroyWindow((GLFWwindow *)_glfw.windowListHead);
    }
    while (_glfw.cursorListHead != (_GLFWcursor *)0x0) {
      glfwDestroyCursor((GLFWcursor *)_glfw.cursorListHead);
    }
    if (0 < _glfw.monitorCount) {
      lVar1 = 0;
      do {
        monitor = _glfw.monitors[lVar1];
        if ((monitor->originalRamp).size != 0) {
          _glfwPlatformSetGammaRamp(monitor,&monitor->originalRamp);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < _glfw.monitorCount);
    }
    _glfwTerminateVulkan();
    _glfwFreeMonitors(_glfw.monitors,_glfw.monitorCount);
    _glfw.monitors = (_GLFWmonitor **)0x0;
    _glfw.monitorCount = 0;
    _glfwPlatformTerminate();
    memset(&_glfw,0,0xdb8);
    _glfwInitialized = 0;
  }
  return;
}

Assistant:

GLFWAPI void glfwTerminate(void)
{
    int i;

    if (!_glfwInitialized)
        return;

    memset(&_glfw.callbacks, 0, sizeof(_glfw.callbacks));

    while (_glfw.windowListHead)
        glfwDestroyWindow((GLFWwindow*) _glfw.windowListHead);

    while (_glfw.cursorListHead)
        glfwDestroyCursor((GLFWcursor*) _glfw.cursorListHead);

    for (i = 0;  i < _glfw.monitorCount;  i++)
    {
        _GLFWmonitor* monitor = _glfw.monitors[i];
        if (monitor->originalRamp.size)
            _glfwPlatformSetGammaRamp(monitor, &monitor->originalRamp);
    }

    _glfwTerminateVulkan();

    _glfwFreeMonitors(_glfw.monitors, _glfw.monitorCount);
    _glfw.monitors = NULL;
    _glfw.monitorCount = 0;

    _glfwPlatformTerminate();

    memset(&_glfw, 0, sizeof(_glfw));
    _glfwInitialized = GLFW_FALSE;
}